

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void trompeloeil::report_match<std::reference_wrapper<int>&(std::reference_wrapper<int>&)>
               (call_matcher_list<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>
                *matcher_list)

{
  list_elem<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *plVar1;
  allocator<char> local_29;
  char *local_28 [4];
  
  plVar1 = (matcher_list->
           super_list<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>,_trompeloeil::ignore_disposer>
           ).
           super_list_elem<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
           .next;
  if (plVar1 != (list_elem<trompeloeil::call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
                 *)matcher_list) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_28,(char *)plVar1[1].prev,&local_29);
    reporter<trompeloeil::specialized>::sendOk(local_28[0]);
    std::__cxx11::string::~string((string *)local_28);
  }
  return;
}

Assistant:

auto
  list<T, Disposer>::begin()
  const
  noexcept
  -> iterator
  {
    return iterator{next};
  }